

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fit-model-simple.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  float fVar1;
  float fVar2;
  pointer pLVar3;
  char *pcVar4;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar5;
  basic_command_line_parser<char> *this;
  size_type sVar6;
  ostream *poVar7;
  basic_ostream<char,_std::char_traits<char>_> *pbVar8;
  long lVar9;
  ulong uVar10;
  Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_> *lm;
  pointer pLVar11;
  __m128 t_2;
  __m128 t_3;
  __m128 t;
  __m128 t_1;
  ulong in_stack_fffffffffffff608;
  LandmarkCollection<Eigen::Vector2f> landmarks;
  int local_9b8;
  int local_9b4;
  int local_9b0;
  int local_9ac;
  Vector3f vertex;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_998 [5];
  vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
  image_points;
  path outputfile;
  vector<int,_std::allocator<int>_> vertex_indices;
  vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
  model_points;
  Mat image;
  uint local_8c8;
  int local_8c4;
  VectorXf local_858;
  RenderingParameters rendering_params;
  _InputArray local_7f8;
  ScaledOrthoProjectionParameters pose;
  _Vector_base<float,_std::allocator<float>_> local_7a8;
  vector<float,_std::allocator<float>_> fitted_coeffs;
  _Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
  local_778;
  _Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
  local_760;
  string outputbasename;
  string mappingsfile;
  string landmarksfile;
  string imagefile;
  string modelfile;
  Mat outimg;
  _Vector_base<int,_std::allocator<int>_> local_648;
  _Vector_base<float,_std::allocator<float>_> local_628;
  string local_608;
  Image4u texturemap;
  string local_5c0;
  string local_5a0;
  string local_580;
  LandmarkMapper landmark_mapper;
  Matrix<float,_3,_4,_0,_3,_4> affine_from_ortho;
  string local_4f8;
  MorphableModel morphable_model;
  Mesh mesh;
  Matrix4f local_168;
  Matrix4f local_128;
  Matrix<float,_3,_4,_0,_3,_4> local_e8;
  ScaledOrthoProjectionParameters local_b8;
  RenderingParameters local_88;
  
  modelfile._M_dataplus._M_p = (pointer)&modelfile.field_2;
  modelfile._M_string_length = 0;
  imagefile._M_dataplus._M_p = (pointer)&imagefile.field_2;
  imagefile._M_string_length = 0;
  modelfile.field_2._M_local_buf[0] = '\0';
  imagefile.field_2._M_local_buf[0] = '\0';
  landmarksfile._M_dataplus._M_p = (pointer)&landmarksfile.field_2;
  landmarksfile._M_string_length = 0;
  mappingsfile._M_dataplus._M_p = (pointer)&mappingsfile.field_2;
  mappingsfile._M_string_length = 0;
  landmarksfile.field_2._M_local_buf[0] = '\0';
  mappingsfile.field_2._M_local_buf[0] = '\0';
  outputbasename._M_dataplus._M_p = (pointer)&outputbasename.field_2;
  outputbasename._M_string_length = 0;
  outputbasename.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&morphable_model,"Allowed options",(allocator<char> *)&image);
  boost::program_options::options_description::options_description
            ((options_description *)&mesh,(string *)&morphable_model,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  std::__cxx11::string::~string((string *)&morphable_model);
  landmark_mapper.landmark_mappings._M_h._M_buckets =
       (__buckets_ptr)boost::program_options::options_description::add_options();
  pcVar4 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)&landmark_mapper,"help,h");
  ptVar5 = boost::program_options::value<std::__cxx11::string>(&modelfile);
  ptVar5->m_required = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&morphable_model,"../share/sfm_shape_3448.bin",(allocator<char> *)&pose);
  ptVar5 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&morphable_model);
  pcVar4 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar4,(value_semantic *)"model,m",(char *)ptVar5);
  ptVar5 = boost::program_options::value<std::__cxx11::string>(&imagefile);
  ptVar5->m_required = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&image,"data/image_0010.png",(allocator<char> *)&affine_from_ortho);
  ptVar5 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&image);
  pcVar4 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar4,(value_semantic *)"image,i",(char *)ptVar5);
  ptVar5 = boost::program_options::value<std::__cxx11::string>(&landmarksfile);
  ptVar5->m_required = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&outimg,"data/image_0010.pts",(allocator<char> *)&texturemap);
  ptVar5 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&outimg);
  pcVar4 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar4,(value_semantic *)"landmarks,l",(char *)ptVar5);
  ptVar5 = boost::program_options::value<std::__cxx11::string>(&mappingsfile);
  ptVar5->m_required = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vertex,"../share/ibug_to_sfm.txt",(allocator<char> *)&outputfile);
  ptVar5 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&vertex);
  pcVar4 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar4,(value_semantic *)"mapping,p",(char *)ptVar5);
  ptVar5 = boost::program_options::value<std::__cxx11::string>(&outputbasename);
  ptVar5->m_required = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&rendering_params,"out",(allocator<char> *)&local_7f8);
  ptVar5 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&rendering_params);
  boost::program_options::options_description_easy_init::operator()
            (pcVar4,(value_semantic *)"output,o",(char *)ptVar5);
  std::__cxx11::string::~string((string *)&rendering_params);
  std::__cxx11::string::~string((string *)&vertex);
  std::__cxx11::string::~string((string *)&outimg);
  std::__cxx11::string::~string((string *)&image);
  std::__cxx11::string::~string((string *)&morphable_model);
  boost::program_options::variables_map::variables_map((variables_map *)&morphable_model);
  boost::program_options::basic_command_line_parser<char>::basic_command_line_parser
            ((basic_command_line_parser<char> *)&image,argc,argv);
  this = boost::program_options::basic_command_line_parser<char>::options
                   ((basic_command_line_parser<char> *)&image,(options_description *)&mesh);
  boost::program_options::basic_command_line_parser<char>::run
            ((basic_parsed_options<char> *)&outimg,this);
  boost::program_options::store
            ((basic_parsed_options *)&outimg,(variables_map *)&morphable_model,false);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
             *)&outimg);
  boost::program_options::detail::cmdline::~cmdline((cmdline *)&image);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&image,"help",(allocator<char> *)&outimg);
  sVar6 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   *)&morphable_model.shape_model.orthonormal_pca_basis,(key_type *)&image);
  std::__cxx11::string::~string((string *)&image);
  if (sVar6 == 0) {
    boost::program_options::notify((variables_map *)&morphable_model);
  }
  else {
    poVar7 = std::operator<<((ostream *)&std::cout,"Usage: fit-model-simple [options]");
    std::endl<char,std::char_traits<char>>(poVar7);
    boost::program_options::operator<<((ostream *)&std::cout,(options_description *)&mesh);
  }
  boost::program_options::variables_map::~variables_map((variables_map *)&morphable_model);
  boost::program_options::options_description::~options_description((options_description *)&mesh);
  if (sVar6 == 0) {
    cv::imread((string *)&image,(int)&imagefile);
    landmarks.
    super__Vector_base<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    landmarks.
    super__Vector_base<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    landmarks.
    super__Vector_base<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string((string *)&local_580,(string *)&landmarksfile);
    eos::core::read_pts_landmarks
              ((LandmarkCollection<Eigen::Vector2f> *)&morphable_model,&local_580);
    std::
    vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
    ::_M_move_assign(&landmarks);
    std::
    vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
    ::~vector((vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
               *)&morphable_model);
    std::__cxx11::string::~string((string *)&local_580);
    morphable_model.expression_model.
    super__Optional_base<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>_>
    ._M_engaged = false;
    morphable_model.landmark_definitions.
    super__Optional_base<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
    ._M_engaged = false;
    memset(&morphable_model,0,0xd0);
    morphable_model.texture_coordinates.
    super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    morphable_model.texture_coordinates.
    super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    morphable_model.texture_coordinates.
    super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    morphable_model.texture_triangle_indices.
    super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    morphable_model.texture_triangle_indices.
    super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    morphable_model.texture_triangle_indices.
    super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string((string *)&local_5a0,(string *)&modelfile);
    eos::morphablemodel::load_model((MorphableModel *)&mesh,&local_5a0);
    eos::morphablemodel::MorphableModel::operator=(&morphable_model,(MorphableModel *)&mesh);
    eos::morphablemodel::MorphableModel::~MorphableModel((MorphableModel *)&mesh);
    std::__cxx11::string::~string((string *)&local_5a0);
    landmark_mapper.landmark_mappings._M_h._M_buckets =
         &landmark_mapper.landmark_mappings._M_h._M_single_bucket;
    landmark_mapper.landmark_mappings._M_h._M_bucket_count = 1;
    landmark_mapper.landmark_mappings._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    landmark_mapper.landmark_mappings._M_h._M_element_count = 0;
    landmark_mapper.landmark_mappings._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    landmark_mapper.landmark_mappings._M_h._M_rehash_policy._M_next_resize = 0;
    landmark_mapper.landmark_mappings._M_h._M_single_bucket = (__node_base_ptr)0x0;
    std::__cxx11::string::string((string *)&local_5c0,(string *)&mappingsfile);
    eos::core::LandmarkMapper::LandmarkMapper((LandmarkMapper *)&mesh,&local_5c0);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::operator=((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&landmark_mapper,
                (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&mesh);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&mesh);
    std::__cxx11::string::~string((string *)&local_5c0);
    cv::Mat::clone();
    pLVar3 = landmarks.
             super__Vector_base<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pLVar11 = landmarks.
                   super__Vector_base<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; pLVar11 != pLVar3;
        pLVar11 = pLVar11 + 1) {
      local_998[0]._M_allocated_capacity = 0;
      vertex.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
           3.7909693e-37;
      unique0x00005300 = &outimg;
      fVar1 = (pLVar11->coordinates).super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.
              m_storage.m_data.array[0];
      fVar2 = (pLVar11->coordinates).super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.
              m_storage.m_data.array[1];
      local_9b0 = (int)ROUND(fVar1 + -2.0);
      local_9ac = (int)ROUND(fVar2 + -2.0);
      local_9b8 = (int)ROUND(fVar1 + 2.0);
      local_9b4 = (int)ROUND(fVar2 + 2.0);
      cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&mesh);
      mesh.vertices.
      super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x406fe00000000000;
      mesh.vertices.
      super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      mesh.vertices.
      super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      mesh.colors.
      super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      in_stack_fffffffffffff608 = in_stack_fffffffffffff608 & 0xffffffff00000000;
      cv::rectangle(&vertex,&local_9b0,&local_9b8,&mesh,1,8,in_stack_fffffffffffff608);
    }
    model_points.
    super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    model_points.
    super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    model_points.
    super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vertex_indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    image_points.
    super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vertex_indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    vertex_indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    image_points.
    super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    image_points.
    super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    lVar9 = 0;
    for (uVar10 = 0;
        uVar10 < (ulong)(((long)landmarks.
                                super__Vector_base<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)landmarks.
                               super__Vector_base<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0x28);
        uVar10 = uVar10 + 1) {
      std::__cxx11::string::string
                ((string *)&local_4f8,
                 (string *)
                 ((long)&(((Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_> *)
                          (&(landmarks.
                             super__Vector_base<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->coordinates + -4))->name).
                         _M_dataplus._M_p + lVar9));
      eos::core::LandmarkMapper::convert
                ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&mesh,&landmark_mapper,&local_4f8);
      std::__cxx11::string::~string((string *)&local_4f8);
      if ((char)mesh.colors.
                super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_finish != '\0') {
        pose.R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0]
             = (float)std::__cxx11::stoi((string *)&mesh,(size_t *)0x0,10);
        eos::morphablemodel::PcaModel::get_mean_at_point((PcaModel *)&vertex,(int)&morphable_model);
        rendering_params._0_8_ = &vertex;
        std::vector<Eigen::Matrix<float,4,1,0,4,1>,std::allocator<Eigen::Matrix<float,4,1,0,4,1>>>::
        emplace_back<Eigen::Homogeneous<Eigen::Matrix<float,3,1,0,3,1>,0>>
                  ((vector<Eigen::Matrix<float,4,1,0,4,1>,std::allocator<Eigen::Matrix<float,4,1,0,4,1>>>
                    *)&model_points,
                   (Homogeneous<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_0> *)&rendering_params);
        std::vector<int,std::allocator<int>>::emplace_back<int_const&>
                  ((vector<int,std::allocator<int>> *)&vertex_indices,(int *)&pose);
        std::vector<Eigen::Matrix<float,2,1,0,2,1>,std::allocator<Eigen::Matrix<float,2,1,0,2,1>>>::
        emplace_back<Eigen::Matrix<float,2,1,0,2,1>&>
                  ((vector<Eigen::Matrix<float,2,1,0,2,1>,std::allocator<Eigen::Matrix<float,2,1,0,2,1>>>
                    *)&image_points,
                   (Matrix<float,_2,_1,_0,_2,_1> *)
                   ((long)((landmarks.
                            super__Vector_base<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->coordinates).
                          super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.
                          m_data.array + lVar9));
      }
      std::
      _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&mesh);
      lVar9 = lVar9 + 0x28;
    }
    std::
    vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
    ::vector((vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
              *)&local_760,&image_points);
    std::
    vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
    ::vector((vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
              *)&local_778,&model_points);
    eos::fitting::estimate_orthographic_projection_linear
              (&pose,(vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                      *)&local_760,
               (vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                *)&local_778,true,(optional<int>)((ulong)local_8c8 | 0x100000000));
    std::
    _Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
    ::~_Vector_base(&local_778);
    std::
    _Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
    ::~_Vector_base(&local_760);
    local_b8.R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1]
         = pose.R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [1];
    local_b8.R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0]
         = pose.R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [0];
    local_b8.R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2]
         = pose.R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [2];
    local_b8.R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3]
         = pose.R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [3];
    local_b8.R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4]
         = pose.R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [4];
    local_b8.R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5]
         = pose.R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [5];
    local_b8.R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6]
         = pose.R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [6];
    local_b8.R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7]
         = pose.R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [7];
    local_b8.R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8]
         = pose.R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
           [8];
    local_b8.tx = pose.tx;
    local_b8.ty = pose.ty;
    local_b8.s = pose.s;
    eos::fitting::RenderingParameters::RenderingParameters
              (&rendering_params,&local_b8,local_8c4,local_8c8);
    eos::fitting::RenderingParameters::get_yaw_pitch_roll((RenderingParameters *)&mesh);
    local_88.camera_type = rendering_params.camera_type;
    local_88.frustum.l = rendering_params.frustum.l;
    local_88.frustum.r = rendering_params.frustum.r;
    local_88.frustum.b = rendering_params.frustum.b;
    local_88.frustum.t = rendering_params.frustum.t;
    local_88.rotation.m_coeffs.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage
    .m_data.array[0] =
         rendering_params.rotation.m_coeffs.
         super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0];
    local_88.rotation.m_coeffs.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage
    .m_data.array[1] =
         rendering_params.rotation.m_coeffs.
         super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1];
    local_88.rotation.m_coeffs.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage
    .m_data.array[2] =
         rendering_params.rotation.m_coeffs.
         super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2];
    local_88.rotation.m_coeffs.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage
    .m_data.array[3] =
         rendering_params.rotation.m_coeffs.
         super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3];
    local_88.t_x = rendering_params.t_x;
    local_88.t_y = rendering_params.t_y;
    local_88.t_z.super__Optional_base<float,_true,_true>._M_payload.
    super__Optional_payload_base<float> =
         rendering_params.t_z.super__Optional_base<float,_true,_true>._M_payload.
         super__Optional_payload_base<float>;
    local_88.fov_y.super__Optional_base<float,_true,_true>._M_payload.
    super__Optional_payload_base<float> =
         rendering_params.fov_y.super__Optional_base<float,_true,_true>._M_payload.
         super__Optional_payload_base<float>;
    local_88.screen_width = rendering_params.screen_width;
    local_88.screen_height = rendering_params.screen_height;
    eos::fitting::get_3x4_affine_camera_matrix(&affine_from_ortho,&local_88,local_8c4,local_8c8);
    local_e8.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[0] =
         affine_from_ortho.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.m_storage.
         m_data.array[0];
    local_e8.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[1] =
         affine_from_ortho.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.m_storage.
         m_data.array[1];
    local_e8.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[2] =
         affine_from_ortho.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.m_storage.
         m_data.array[2];
    local_e8.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[3] =
         affine_from_ortho.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.m_storage.
         m_data.array[3];
    local_e8.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[4] =
         affine_from_ortho.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.m_storage.
         m_data.array[4];
    local_e8.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[5] =
         affine_from_ortho.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.m_storage.
         m_data.array[5];
    local_e8.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[6] =
         affine_from_ortho.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.m_storage.
         m_data.array[6];
    local_e8.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[7] =
         affine_from_ortho.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.m_storage.
         m_data.array[7];
    local_e8.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[8] =
         affine_from_ortho.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.m_storage.
         m_data.array[8];
    local_e8.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[9] =
         affine_from_ortho.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.m_storage.
         m_data.array[9];
    local_e8.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[10]
         = affine_from_ortho.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.m_storage.
           m_data.array[10];
    local_e8.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[0xb]
         = affine_from_ortho.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.m_storage.
           m_data.array[0xb];
    local_858.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (float *)0x0;
    local_858.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
    eos::fitting::fit_shape_to_landmarks_linear
              (&fitted_coeffs,&morphable_model.shape_model,&local_e8,&image_points,&vertex_indices,
               &local_858,3.0,(optional<int>)0x0,(optional<float>)0x0,(optional<float>)0x0);
    free(local_858.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)&local_7a8,&fitted_coeffs);
    local_628._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_628._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_628._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    eos::morphablemodel::MorphableModel::draw_sample
              (&mesh,&morphable_model,(vector<float,_std::allocator<float>_> *)&local_7a8,
               (vector<float,_std::allocator<float>_> *)&local_628);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_628);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_7a8);
    eos::fitting::RenderingParameters::get_modelview(&local_128,&rendering_params);
    eos::fitting::RenderingParameters::get_projection(&local_168,&rendering_params);
    eos::core::from_mat_with_alpha((Image4u *)&vertex,&image);
    eos::render::extract_texture
              (&texturemap,&mesh,&local_128,&local_168,Orthographic,(Image4u *)&vertex,0x200);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_998);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vertex,
                   &outputbasename,".obj");
    std::__cxx11::string::string((string *)&outputfile,(string *)&vertex);
    std::__cxx11::string::~string((string *)&vertex);
    std::__cxx11::string::string((string *)&local_608,(string *)&outputfile);
    eos::core::write_textured_obj(&mesh,&local_608);
    std::__cxx11::string::~string((string *)&local_608);
    boost::filesystem::path::path((path *)&vertex,".texture.png");
    boost::filesystem::path::replace_extension(&outputfile);
    std::__cxx11::string::~string((string *)&vertex);
    eos::core::to_mat((core *)&vertex,&texturemap);
    local_7f8.sz.width = 0;
    local_7f8.sz.height = 0;
    local_7f8.flags = 0x1010000;
    local_648._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_648._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_648._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_7f8.obj = (core *)&vertex;
    cv::imwrite((string *)&outputfile,&local_7f8,(vector *)&local_648);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_648);
    cv::Mat::~Mat((Mat *)&vertex);
    poVar7 = std::operator<<((ostream *)&std::cout,
                             "Finished fitting and wrote result mesh and texture to files with basename "
                            );
    boost::filesystem::path::stem();
    boost::filesystem::path::stem();
    pbVar8 = boost::filesystem::operator<<(poVar7,(path *)&vertex);
    poVar7 = std::operator<<(pbVar8,".");
    std::endl<char,std::char_traits<char>>(poVar7);
    std::__cxx11::string::~string((string *)&vertex);
    std::__cxx11::string::~string((string *)&local_7f8);
    std::__cxx11::string::~string((string *)&outputfile);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&texturemap.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    eos::core::Mesh::~Mesh(&mesh);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&fitted_coeffs.super__Vector_base<float,_std::allocator<float>_>);
    std::
    _Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
    ::~_Vector_base(&image_points.
                     super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                   );
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&vertex_indices.super__Vector_base<int,_std::allocator<int>_>);
    std::
    _Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
    ::~_Vector_base(&model_points.
                     super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                   );
    cv::Mat::~Mat(&outimg);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&landmark_mapper);
    eos::morphablemodel::MorphableModel::~MorphableModel(&morphable_model);
    std::
    vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
    ::~vector(&landmarks);
    cv::Mat::~Mat(&image);
  }
  std::__cxx11::string::~string((string *)&outputbasename);
  std::__cxx11::string::~string((string *)&mappingsfile);
  std::__cxx11::string::~string((string *)&landmarksfile);
  std::__cxx11::string::~string((string *)&imagefile);
  std::__cxx11::string::~string((string *)&modelfile);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
    string modelfile, imagefile, landmarksfile, mappingsfile, outputbasename;
    try
    {
        po::options_description desc("Allowed options");
        // clang-format off
        desc.add_options()
            ("help,h", "display the help message")
            ("model,m", po::value<string>(&modelfile)->required()->default_value("../share/sfm_shape_3448.bin"),
                "a Morphable Model stored as cereal BinaryArchive")
            ("image,i", po::value<string>(&imagefile)->required()->default_value("data/image_0010.png"),
                "an input image")
            ("landmarks,l", po::value<string>(&landmarksfile)->required()->default_value("data/image_0010.pts"),
                "2D landmarks for the image, in ibug .pts format")
            ("mapping,p", po::value<string>(&mappingsfile)->required()->default_value("../share/ibug_to_sfm.txt"),
                "landmark identifier to model vertex number mapping")
            ("output,o", po::value<string>(&outputbasename)->required()->default_value("out"),
                "basename for the output rendering and obj files");
        // clang-format on
        po::variables_map vm;
        po::store(po::command_line_parser(argc, argv).options(desc).run(), vm);
        if (vm.count("help"))
        {
            cout << "Usage: fit-model-simple [options]" << endl;
            cout << desc;
            return EXIT_SUCCESS;
        }
        po::notify(vm);
    } catch (const po::error& e)
    {
        cout << "Error while parsing command-line arguments: " << e.what() << endl;
        cout << "Use --help to display a list of options." << endl;
        return EXIT_FAILURE;
    }

    // Load the image, landmarks, LandmarkMapper and the Morphable Model:
    Mat image = cv::imread(imagefile);
    LandmarkCollection<Eigen::Vector2f> landmarks;
    try
    {
        landmarks = core::read_pts_landmarks(landmarksfile);
    } catch (const std::runtime_error& e)
    {
        cout << "Error reading the landmarks: " << e.what() << endl;
        return EXIT_FAILURE;
    }
    morphablemodel::MorphableModel morphable_model;
    try
    {
        morphable_model = morphablemodel::load_model(modelfile);
    } catch (const std::runtime_error& e)
    {
        cout << "Error loading the Morphable Model: " << e.what() << endl;
        return EXIT_FAILURE;
    }
    // The landmark mapper is used to map 2D landmark points (e.g. from the ibug scheme) to vertex ids:
    core::LandmarkMapper landmark_mapper;
    try
    {
        landmark_mapper = core::LandmarkMapper(mappingsfile);
    } catch (const std::exception& e)
    {
        cout << "Error loading the landmark mappings: " << e.what() << endl;
        return EXIT_FAILURE;
    }

    // Draw the loaded landmarks:
    Mat outimg = image.clone();
    for (auto&& lm : landmarks)
    {
        cv::rectangle(outimg, cv::Point2f(lm.coordinates[0] - 2.0f, lm.coordinates[1] - 2.0f),
                      cv::Point2f(lm.coordinates[0] + 2.0f, lm.coordinates[1] + 2.0f), {255, 0, 0});
    }

    // These will be the final 2D and 3D points used for the fitting:
    vector<Vector4f> model_points; // the points in the 3D shape model
    vector<int> vertex_indices;    // their vertex indices
    vector<Vector2f> image_points; // the corresponding 2D landmark points

    // Sub-select all the landmarks which we have a mapping for (i.e. that are defined in the 3DMM):
    for (int i = 0; i < landmarks.size(); ++i)
    {
        const auto converted_name = landmark_mapper.convert(landmarks[i].name);
        if (!converted_name)
        { // no mapping defined for the current landmark
            continue;
        }
        const int vertex_idx = std::stoi(converted_name.value());
        const auto vertex = morphable_model.get_shape_model().get_mean_at_point(vertex_idx);
        model_points.emplace_back(vertex.homogeneous());
        vertex_indices.emplace_back(vertex_idx);
        image_points.emplace_back(landmarks[i].coordinates);
    }

    // Estimate the camera (pose) from the 2D - 3D point correspondences
    fitting::ScaledOrthoProjectionParameters pose =
        fitting::estimate_orthographic_projection_linear(image_points, model_points, true, image.rows);
    fitting::RenderingParameters rendering_params(pose, image.cols, image.rows);

    // The 3D head pose can be recovered as follows - the function returns an Eigen::Vector3f with yaw, pitch,
    // and roll angles:
    const float yaw_angle = rendering_params.get_yaw_pitch_roll()[0];

    // Estimate the shape coefficients by fitting the shape to the landmarks:
    const Eigen::Matrix<float, 3, 4> affine_from_ortho =
        fitting::get_3x4_affine_camera_matrix(rendering_params, image.cols, image.rows);
    const vector<float> fitted_coeffs = fitting::fit_shape_to_landmarks_linear(
        morphable_model.get_shape_model(), affine_from_ortho, image_points, vertex_indices);

    // Obtain the full mesh with the estimated coefficients:
    const core::Mesh mesh = morphable_model.draw_sample(fitted_coeffs, vector<float>());

    // Extract the texture from the image using given mesh and camera parameters:
    const core::Image4u texturemap =
        render::extract_texture(mesh, rendering_params.get_modelview(), rendering_params.get_projection(),
                                render::ProjectionType::Orthographic, core::from_mat_with_alpha(image));

    // Save the mesh as textured obj:
    fs::path outputfile = outputbasename + ".obj";
    core::write_textured_obj(mesh, outputfile.string());

    // And save the texture map:
    outputfile.replace_extension(".texture.png");
    cv::imwrite(outputfile.string(), core::to_mat(texturemap));

    cout << "Finished fitting and wrote result mesh and texture to files with basename "
         << outputfile.stem().stem() << "." << endl;

    return EXIT_SUCCESS;
}